

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_client.c
# Opt level: O3

int proxy_client_connect(proxy_client_handle *ch)

{
  conn_handle *conn;
  uint8_t *buff;
  int iVar1;
  uint32_t nonce;
  size_t buff_len;
  char *password;
  char nonce_str [8];
  uint8_t response [16];
  uint8_t local_40 [8];
  uint8_t local_38 [24];
  
  conn = (conn_handle *)ch->priv;
  password = "PUBLIC";
  if (ch->password != (char *)0x0) {
    password = ch->password;
  }
  iVar1 = conn_connect(conn,ch->host_addr,ch->host_port);
  if ((-1 < iVar1) && (iVar1 = conn_recv(conn,local_40,8), -1 < iVar1)) {
    nonce = hex32_to_digest((char *)local_40);
    iVar1 = get_password_response(nonce,password,local_38);
    if (-1 < iVar1) {
      buff = (uint8_t *)ch->callsign;
      if (buff != (uint8_t *)0x0) {
        buff_len = strlen((char *)buff);
        iVar1 = conn_send(conn,buff,buff_len);
        if (iVar1 < 0) goto LAB_001055d8;
      }
      iVar1 = conn_send(conn,"\n",1);
      if ((-1 < iVar1) && (iVar1 = conn_send(conn,local_38,0x10), -1 < iVar1)) {
        return 0;
      }
    }
  }
LAB_001055d8:
  conn_close(conn);
  return iVar1;
}

Assistant:

int proxy_client_connect(struct proxy_client_handle *ch)
{
	struct proxy_client_priv *priv = ch->priv;
	const char *password = ch->password;
	uint32_t nonce;
	char nonce_str[8];
	uint8_t response[PROXY_PASS_RES_LEN];
	int ret;

	if (password == NULL)
		password = "PUBLIC";

	ret = conn_connect(&priv->conn, ch->host_addr, ch->host_port);
	if (ret < 0)
		goto proxy_client_connection_exit;

	/* Receive the nonce */
	ret = conn_recv(&priv->conn, (uint8_t *)nonce_str,
			sizeof(nonce_str));
	if (ret < 0)
		goto proxy_client_connection_exit;

	nonce = hex32_to_digest(nonce_str);

	/* Compute the password response */
	ret = get_password_response(nonce, password, response);
	if (ret < 0)
		goto proxy_client_connection_exit;

	/* Send the callsign, a newline, and the response */
	if (ch->callsign != NULL) {
		ret = conn_send(&priv->conn, (uint8_t *)ch->callsign,
				strlen(ch->callsign));
		if (ret < 0)
			goto proxy_client_connection_exit;
	}

	ret = conn_send(&priv->conn, (uint8_t *)"\n", 1);
	if (ret < 0)
		goto proxy_client_connection_exit;

	ret = conn_send(&priv->conn, response, PROXY_PASS_RES_LEN);
	if (ret < 0)
		goto proxy_client_connection_exit;

	/* No news is good news, so we won't know how things went
	 * until we actually try to process the returning messages
	 */

	return 0;

proxy_client_connection_exit:
	conn_close(&priv->conn);

	return ret;
}